

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O0

int ON_ArePointsOnPlane(int dim,bool is_rat,int count,int stride,double *point,ON_BoundingBox *bbox,
                       ON_Plane *plane,double tolerance)

{
  ON_3dPoint p;
  ON_3dPoint p_00;
  ON_3dPoint p_01;
  bool bVar1;
  ON_3dPoint *pOVar2;
  double dVar3;
  int local_130;
  ON_3dPoint local_110;
  double local_f8;
  double local_f0;
  double local_e8;
  ON_3dPoint local_e0;
  ON_3dVector local_c8;
  double local_b0;
  double local_a8;
  double local_a0;
  ON_3dPoint local_98;
  ON_3dVector local_80;
  undefined1 local_68 [8];
  ON_3dPoint Q;
  int rc;
  int k;
  int j;
  int i;
  double w;
  double tolerance_local;
  ON_BoundingBox *bbox_local;
  double *point_local;
  int stride_local;
  int count_local;
  int iStack_c;
  bool is_rat_local;
  int dim_local;
  
  if (count < 1) {
    iStack_c = 0;
  }
  else {
    bVar1 = ON_Plane::IsValid(plane);
    if (bVar1) {
      bVar1 = ON_BoundingBox::IsValid(bbox);
      if (bVar1) {
        bVar1 = ON_IsValid(tolerance);
        if ((!bVar1) || (tolerance < 0.0)) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_plane.cpp"
                     ,0x232,"","tolerance must be >= 0.0");
          iStack_c = 0;
        }
        else if ((dim < 2) || (3 < dim)) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_plane.cpp"
                     ,0x237,"","dim must be 2 or 3");
          iStack_c = 0;
        }
        else {
          local_130 = dim;
          if (is_rat) {
            local_130 = dim + 1;
          }
          if (stride < local_130) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_plane.cpp"
                       ,0x23c,"","stride parameter is too small");
            iStack_c = 0;
          }
          else if (point == (double *)0x0) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_plane.cpp"
                       ,0x241,"","point parameter is null");
            iStack_c = 0;
          }
          else {
            Q.z._0_4_ = 0;
            w = tolerance;
            if ((tolerance == 0.0) && (!NAN(tolerance))) {
              w = ON_BoundingBox::Tolerance(bbox);
            }
            bVar1 = true;
            if (count != 1) {
              ON_BoundingBox::Diagonal(&local_80,bbox);
              dVar3 = ON_3dVector::Length(&local_80);
              bVar1 = dVar3 <= w;
            }
            Q.z._0_4_ = 1;
            if (bVar1) {
              Q.z._0_4_ = 2;
            }
            for (k = 0; Q.z._0_4_ != 0 && k < 2; k = k + 1) {
              pOVar2 = ON_BoundingBox::operator[](bbox,k);
              local_68 = (undefined1  [8])pOVar2->x;
              for (rc = 0; Q.z._0_4_ != 0 && rc < 2; rc = rc + 1) {
                pOVar2 = ON_BoundingBox::operator[](bbox,rc);
                Q.x = pOVar2->y;
                for (Q.z._4_4_ = 0; Q.z._0_4_ != 0 && Q.z._4_4_ < 2; Q.z._4_4_ = Q.z._4_4_ + 1) {
                  pOVar2 = ON_BoundingBox::operator[](bbox,Q.z._4_4_);
                  local_a0 = pOVar2->z;
                  local_b0 = (double)local_68;
                  local_a8 = Q.x;
                  p.y = Q.x;
                  p.x = (double)local_68;
                  p.z = local_a0;
                  Q.y = local_a0;
                  ON_Plane::ClosestPointTo(&local_98,plane,p);
                  dVar3 = ON_3dPoint::DistanceTo((ON_3dPoint *)local_68,&local_98);
                  if (w < dVar3) {
                    Q.z._0_4_ = 0;
                  }
                }
              }
            }
            if (Q.z._0_4_ == 0) {
              local_68 = (undefined1  [8])ON_3dPoint::Origin.x;
              Q.x = ON_3dPoint::Origin.y;
              Q.y = ON_3dPoint::Origin.z;
              bVar1 = true;
              if (count != 1) {
                ON_BoundingBox::Diagonal(&local_c8,bbox);
                dVar3 = ON_3dVector::Length(&local_c8);
                bVar1 = dVar3 <= w;
              }
              Q.z._0_4_ = 1;
              if (bVar1) {
                Q.z._0_4_ = 2;
              }
              bbox_local = (ON_BoundingBox *)point;
              if (is_rat) {
                for (k = 0; k < count; k = k + 1) {
                  dVar3 = (&(bbox_local->m_min).x)[dim];
                  if ((dVar3 == 0.0) && (!NAN(dVar3))) {
                    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_plane.cpp"
                               ,0x263,"","rational point has zero weight");
                    return 0;
                  }
                  ON_ArrayScale(dim,1.0 / dVar3,(double *)bbox_local,(double *)local_68);
                  local_f8 = (double)local_68;
                  local_f0 = Q.x;
                  local_e8 = Q.y;
                  p_00.y = Q.x;
                  p_00.x = (double)local_68;
                  p_00.z = Q.y;
                  ON_Plane::ClosestPointTo(&local_e0,plane,p_00);
                  dVar3 = ON_3dPoint::DistanceTo((ON_3dPoint *)local_68,&local_e0);
                  if (w < dVar3) {
                    Q.z._0_4_ = 0;
                    break;
                  }
                  bbox_local = (ON_BoundingBox *)(&(bbox_local->m_min).x + stride);
                }
              }
              else {
                for (k = 0; k < count; k = k + 1) {
                  memcpy(local_68,bbox_local,(long)dim << 3);
                  p_01.y = Q.x;
                  p_01.x = (double)local_68;
                  p_01.z = Q.y;
                  ON_Plane::ClosestPointTo(&local_110,plane,p_01);
                  dVar3 = ON_3dPoint::DistanceTo((ON_3dPoint *)local_68,&local_110);
                  if (w < dVar3) {
                    Q.z._0_4_ = 0;
                    break;
                  }
                  bbox_local = (ON_BoundingBox *)(&(bbox_local->m_min).x + stride);
                }
              }
            }
            iStack_c = Q.z._0_4_;
          }
        }
      }
      else {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_plane.cpp"
                   ,0x22d,"","bbox parameter is not valid");
        iStack_c = 0;
      }
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_plane.cpp"
                 ,0x228,"","plane parameter is not valid");
      iStack_c = 0;
    }
  }
  return iStack_c;
}

Assistant:

int ON_ArePointsOnPlane( // returns 0=no, 1 = yes, 2 = pointset is (to tolerance) a single point on the line
        int dim,     // 2 or 3
        bool is_rat,
        int count, 
        int stride, const double* point,
        const ON_BoundingBox& bbox, // if needed, use ON_GetBoundingBox(dim,is_rat,count,stride,point)
        const ON_Plane& plane,  // line to test
        double tolerance
        )
{
  double w;
  int i, j, k;

  if ( count < 1 )
    return 0;
  if ( !plane.IsValid() )
  {
    ON_ERROR("plane parameter is not valid");
    return 0;
  }
  if ( !bbox.IsValid() )
  {
    ON_ERROR("bbox parameter is not valid");
    return 0;
  }
  if ( !ON_IsValid(tolerance) || tolerance < 0.0 )
  {
    ON_ERROR("tolerance must be >= 0.0");
    return 0;
  }
  if ( dim < 2 || dim > 3 )
  {
    ON_ERROR("dim must be 2 or 3");
    return 0;
  }
  if ( stride < (is_rat?(dim+1):dim) )
  {
    ON_ERROR("stride parameter is too small");
    return 0;
  }
  if ( 0 == point )
  {
    ON_ERROR("point parameter is null");
    return 0;
  }

  int rc = 0;

  if ( tolerance == 0.0 ) {
    tolerance = bbox.Tolerance();
  }

  ON_3dPoint Q;

  // test bounding box to quickly detect the common coordinate axis cases
  rc = (count == 1 || bbox.Diagonal().Length() <= tolerance) ? 2 : 1;
  for ( i = 0; rc && i < 2; i++ ) {
    Q.x = bbox[i].x;
    for ( j = 0; rc && j < 2; j++) {
      Q.y = bbox[j].y;
      for ( k = 0; rc && k < 2; k++) {
        Q.z = bbox[k].z;
        if ( Q.DistanceTo( plane.ClosestPointTo( Q ) ) > tolerance )
          rc = 0;
      }
    }
  }

  if ( !rc ) {
    // test points one by one
    Q = ON_3dPoint::Origin;
    rc = (count == 1 || bbox.Diagonal().Length() <= tolerance) ? 2 : 1;
    if ( is_rat ) {
      for ( i = 0; i < count; i++ ) {
        w = point[dim];
        if ( w == 0.0 ) {
          ON_ERROR("rational point has zero weight");
          return 0;
        }
        ON_ArrayScale( dim, 1.0/w, point, &Q.x );
        if ( Q.DistanceTo( plane.ClosestPointTo( Q ) ) > tolerance ) {
          rc = 0;
          break;
        }
        point += stride;
      }
    }
    else {
      for ( i = 0; i < count; i++ ) {
        memcpy( &Q.x, point, dim*sizeof(Q.x) );
        if ( Q.DistanceTo( plane.ClosestPointTo( Q ) ) > tolerance ) {
          rc = 0;
          break;
        }
        point += stride;
      }
    }
  }

  return rc;
}